

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_31::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  code *pcVar1;
  _func_int *p_Var2;
  Own<kj::_::PromiseNode> OVar3;
  _func_int ***ppp_Var4;
  _func_int ***ppp_Var5;
  WebSocket WVar6;
  Disposer *pDVar7;
  uchar *puVar8;
  size_t sVar9;
  int iVar10;
  TransformPromiseNodeBase *pTVar11;
  undefined4 extraout_var;
  PromiseNode *pPVar13;
  Disposer *pDVar14;
  undefined4 extraout_var_00;
  PromiseNode *pPVar15;
  ChainPromiseNode *pCVar16;
  ChainPromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar17;
  bool fin;
  undefined7 in_register_00000031;
  _func_int **pp_Var18;
  PromiseNode *in_R8;
  PromiseNode *pPVar19;
  Own<kj::_::ChainPromiseNode> OVar20;
  Own<kj::_::PromiseNode> OVar21;
  ArrayPtr<const_unsigned_char> AVar22;
  Promise<void> PVar23;
  Mask mask;
  Array<unsigned_char> ownMessage;
  Array<unsigned_char> result;
  undefined4 local_8c;
  WebSocket local_88;
  Disposer *pDStack_80;
  undefined8 *local_78;
  Array<unsigned_char> local_68;
  WebSocketImpl *local_50;
  Promise<void> local_48;
  WebSocketImpl *pWVar12;
  
  pp_Var18 = (_func_int **)CONCAT71(in_register_00000031,opcode);
  pPVar15 = (PromiseNode *)message.size_;
  if (*(char *)((long)pp_Var18 + 0x21) == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
              ((Fault *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x968,FAILED,"!disconnected","\"WebSocket can\'t send after disconnect()\"",
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
  if (*(char *)((long)pp_Var18 + 0x22) == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              ((Fault *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x969,FAILED,"!currentlySending","\"another message send is already in progress\"",
               (char (*) [44])"another message send is already in progress");
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
  *(undefined1 *)((long)pp_Var18 + 0x22) = 1;
  fin = message.ptr._0_1_;
  if (*(char *)(pp_Var18 + 0xf) == '\x01') {
    local_50 = this;
    pTVar11 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(Own<kj::_::PromiseNode> *)(pp_Var18 + 0x10),
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2415:30),_kj::_::PropagateException>
               ::anon_class_32_3_f7a759be_for_func::operator());
    (pTVar11->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442868;
    pTVar11[1].super_PromiseNode._vptr_PromiseNode = pp_Var18;
    *(bool *)&pTVar11[1].dependency.disposer = fin;
    pTVar11[1].dependency.ptr = pPVar15;
    pTVar11[1].continuationTracePtr = in_R8;
    local_68.ptr = (uchar *)&_::
                             HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#1},kj::_::PropagateException>>
                             ::instance;
    local_68.size_ = (size_t)pTVar11;
    OVar20 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                       ((kj *)&local_88,(Own<kj::_::PromiseNode> *)&local_68);
    sVar9 = local_68.size_;
    pCVar16 = OVar20.ptr;
    (local_50->super_WebSocket)._vptr_WebSocket = local_88._vptr_WebSocket;
    (local_50->stream).disposer = pDStack_80;
    pWVar12 = local_50;
    if ((TransformPromiseNodeBase *)local_68.size_ != (TransformPromiseNodeBase *)0x0) {
      local_68.size_ = 0;
      iVar10 = (*(code *)**(undefined8 **)local_68.ptr)
                         (local_68.ptr,
                          ((PromiseNode *)sVar9)->_vptr_PromiseNode[-2] +
                          (long)&((PromiseNode *)sVar9)->_vptr_PromiseNode);
      pWVar12 = (WebSocketImpl *)CONCAT44(extraout_var,iVar10);
      pCVar16 = extraout_RDX;
    }
    OVar3.ptr = &pCVar16->super_PromiseNode;
    OVar3.disposer = (Disposer *)pWVar12;
    OVar21.ptr = &pCVar16->super_PromiseNode;
    OVar21.disposer = (Disposer *)pWVar12;
    if (*(char *)(pp_Var18 + 0xf) == '\x01') {
      *(undefined1 *)(pp_Var18 + 0xf) = 0;
      p_Var2 = pp_Var18[0x11];
      OVar21 = OVar3;
      if (p_Var2 != (_func_int *)0x0) {
        pp_Var18[0x11] = (_func_int *)0x0;
        OVar21 = (Own<kj::_::PromiseNode>)
                 (*(code *)**(undefined8 **)pp_Var18[0x10])
                           (pp_Var18[0x10],p_Var2 + *(long *)(*(long *)p_Var2 + -0x10));
      }
    }
  }
  else {
    *(byte *)(pp_Var18 + 4) = *(byte *)(pp_Var18 + 4) | fin == true;
    p_Var2 = pp_Var18[3];
    pPVar19 = in_R8;
    pPVar13 = pPVar15;
    if (p_Var2 == (_func_int *)0x0) {
      local_8c = 0;
      local_88._vptr_WebSocket = (_func_int **)0x0;
      pDStack_80 = (Disposer *)0x0;
      local_78 = (undefined8 *)0x0;
    }
    else {
      local_50 = this;
      (*(code *)**(undefined8 **)p_Var2)(p_Var2,&local_8c,4);
      local_88._vptr_WebSocket = (_func_int **)0x0;
      pDStack_80 = (Disposer *)0x0;
      local_78 = (undefined8 *)0x0;
      this = local_50;
      if (local_8c != 0) {
        pPVar19 = (PromiseNode *)0x0;
        pPVar13 = (PromiseNode *)
                  _::HeapArrayDisposer::allocateImpl
                            (1,0,(size_t)in_R8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                            );
        pPVar17 = pPVar13;
        if (in_R8 != (PromiseNode *)0x0) {
          pPVar17 = (PromiseNode *)
                    ((long)&in_R8[-10]._vptr_PromiseNode + (long)&pPVar13[10]._vptr_PromiseNode);
          memcpy(pPVar13,pPVar15,(size_t)in_R8);
        }
        pDVar14 = pDStack_80;
        WVar6._vptr_WebSocket = local_88._vptr_WebSocket;
        in_R8 = (PromiseNode *)((long)pPVar17 - (long)pPVar13);
        local_68.ptr = (uchar *)pPVar13;
        local_68.size_ = (size_t)in_R8;
        local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
        if ((PromiseNode *)local_88._vptr_WebSocket != (PromiseNode *)0x0) {
          local_88._vptr_WebSocket = (_func_int **)0x0;
          pDStack_80 = (Disposer *)0x0;
          (**(code **)*local_78)(local_78,WVar6._vptr_WebSocket,1,pDVar14,pDVar14,0);
          pPVar19 = (PromiseNode *)pDVar14;
        }
        local_88._vptr_WebSocket = (_func_int **)pPVar13;
        pDStack_80 = (Disposer *)in_R8;
        local_78 = &_::HeapArrayDisposer::instance;
        this = local_50;
        if (pPVar17 == pPVar13) {
          in_R8 = (PromiseNode *)0x0;
        }
        else {
          pPVar15 = (PromiseNode *)0x0;
          do {
            pcVar1 = (code *)((long)&pPVar13->_vptr_PromiseNode +
                             (long)&(pPVar15 + -10)[10]._vptr_PromiseNode);
            *pcVar1 = (code)((byte)*pcVar1 ^ *(byte *)((long)&local_8c + (ulong)((uint)pPVar15 & 3))
                            );
            pPVar15 = (PromiseNode *)((long)&pPVar15->_vptr_PromiseNode + 1);
          } while (in_R8 != pPVar15);
        }
      }
    }
    AVar22 = Header::compose((Header *)((long)pp_Var18 + 0x23),fin,(byte)in_R8,(ulong)local_8c,
                             (Mask)SUB84(pPVar19,0));
    *(ArrayPtr<const_unsigned_char> *)(pp_Var18 + 7) = AVar22;
    pp_Var18[9] = (_func_int *)pPVar13;
    pp_Var18[10] = (_func_int *)in_R8;
    (**(code **)(*(long *)(pp_Var18[2] + 8) + 8))(&local_68,pp_Var18[2] + 8,pp_Var18 + 7,2);
    pPVar15 = (PromiseNode *)local_68.size_;
    if (((local_8c._1_1_ != '\0' || (char)local_8c != '\0') || local_8c._2_1_ != '\0') ||
        local_8c._3_1_ != '\0') {
      PVar23 = Promise<void>::attach<kj::Array<unsigned_char>>(&local_48,&local_68);
      puVar8 = local_68.ptr;
      local_68.ptr = (uchar *)CONCAT44(local_48.super_PromiseBase.node.disposer._4_4_,
                                       local_48.super_PromiseBase.node.disposer._0_4_);
      pPVar15 = local_48.super_PromiseBase.node.ptr;
      local_48.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      if (((PromiseNode *)local_68.size_ != (PromiseNode *)0x0) &&
         (ppp_Var4 = (_func_int ***)local_68.size_, ppp_Var5 = (_func_int ***)local_68.size_,
         local_68.size_ = (size_t)pPVar15,
         (***(_func_int ***)puVar8)
                   (puVar8,(*ppp_Var4)[-2] + (long)ppp_Var5,PVar23.super_PromiseBase.node.ptr),
         pPVar19 = local_48.super_PromiseBase.node.ptr, pPVar15 = (PromiseNode *)local_68.size_,
         local_48.super_PromiseBase.node.ptr != (PromiseNode *)0x0)) {
        local_48.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT44(local_48.super_PromiseBase.node.disposer._4_4_,
                             local_48.super_PromiseBase.node.disposer._0_4_))
                  ((undefined8 *)
                   CONCAT44(local_48.super_PromiseBase.node.disposer._4_4_,
                            local_48.super_PromiseBase.node.disposer._0_4_),
                   pPVar19->_vptr_PromiseNode[-2] + (long)&pPVar19->_vptr_PromiseNode);
        pPVar15 = (PromiseNode *)local_68.size_;
      }
    }
    local_68.size_ = (size_t)pPVar15;
    pTVar11 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(Own<kj::_::PromiseNode> *)&local_68,
               _::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2445:25),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    sVar9 = local_68.size_;
    (pTVar11->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004428f0;
    pTVar11[1].super_PromiseNode._vptr_PromiseNode = pp_Var18;
    pDVar14 = (Disposer *)
              &_::
               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#2},kj::_::PropagateException>>
               ::instance;
    (this->super_WebSocket)._vptr_WebSocket =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#2},kj::_::PropagateException>>
          ::instance;
    (this->stream).disposer = (Disposer *)pTVar11;
    pPVar15 = extraout_RDX_00;
    if ((PromiseNode *)local_68.size_ != (PromiseNode *)0x0) {
      local_68.size_ = 0;
      iVar10 = (***(_func_int ***)local_68.ptr)
                         (local_68.ptr,(*(_func_int ***)sVar9)[-2] + (long)(_func_int ***)sVar9);
      pDVar14 = (Disposer *)CONCAT44(extraout_var_00,iVar10);
      pPVar15 = extraout_RDX_01;
    }
    pDVar7 = pDStack_80;
    WVar6._vptr_WebSocket = local_88._vptr_WebSocket;
    OVar21.ptr = pPVar15;
    OVar21.disposer = pDVar14;
    if ((PromiseNode *)local_88._vptr_WebSocket != (PromiseNode *)0x0) {
      local_88._vptr_WebSocket = (_func_int **)0x0;
      pDStack_80 = (Disposer *)0x0;
      OVar21 = (Own<kj::_::PromiseNode>)
               (**(code **)*local_78)(local_78,WVar6._vptr_WebSocket,1,pDVar7,pDVar7,0);
    }
  }
  return (PromiseBase)(PromiseBase)OVar21;
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    KJ_IF_MAYBE(p, sendingPong) {
      // We recently sent a pong, make sure it's finished before proceeding.
      auto promise = p->then([this, opcode, message]() {
        currentlySending = false;
        return sendImpl(opcode, message);
      });
      sendingPong = nullptr;
      return promise;
    }

    // We don't stop the application from sending further messages after close() -- this is the
    // application's error to make. But, we do want to make sure we don't send any PONGs after a
    // close, since that would be our error. So we stack whether we closed for that reason.
    hasSentClose = hasSentClose || opcode == OPCODE_CLOSE;

    Mask mask(maskKeyGenerator);

    kj::Array<byte> ownMessage;
    if (!mask.isZero()) {
      // Sadness, we have to make a copy to apply the mask.
      ownMessage = kj::heapArray(message);
      mask.apply(ownMessage);
      message = ownMessage;
    }

    sendParts[0] = sendHeader.compose(true, opcode, message.size(), mask);
    sendParts[1] = message;

    auto promise = stream->write(sendParts);
    if (!mask.isZero()) {
      promise = promise.attach(kj::mv(ownMessage));
    }
    return promise.then([this]() {
      currentlySending = false;

      // Send queued pong if needed.
      KJ_IF_MAYBE(q, queuedPong) {
        kj::Array<byte> payload = kj::mv(*q);
        queuedPong = nullptr;
        queuePong(kj::mv(payload));
      }
    });
  }